

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_performOptIRStable
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,SolRational *sol,bool acceptUnbounded,bool acceptInfeasible,
          int minIRRoundsRemaining,bool *primalFeasible,bool *dualFeasible,bool *infeasible,
          bool *unbounded,bool *stoppedTime,bool *stoppedIter,bool *error)

{
  Timer *pTVar1;
  bool bVar2;
  type_conflict5 tVar3;
  undefined1 uVar4;
  Verbosity VVar5;
  SPxStatus SVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  undefined4 uVar10;
  SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar11;
  char *pcVar12;
  RangeType *pRVar13;
  VarStatus *pVVar14;
  byte in_CL;
  byte in_DL;
  int __c;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RSI;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_RDI;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *this_00;
  int in_R8D;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_R9;
  longdouble lVar15;
  Rational *extraout_XMM0_Qa;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000008;
  undefined1 *in_stack_00000010;
  undefined1 *in_stack_00000018;
  SolRational *in_stack_00000020;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000028;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_00000030;
  int r_1;
  int numCorrectedPrimals;
  int primalSize;
  int simplifier;
  int prevIterations;
  int col;
  int row;
  int i;
  int numOrigCols;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  bool continueAfter;
  bool breakAfter;
  int nextRatrecRefinement;
  int lastStallRefinements;
  bool factorSolNewBasis;
  int maxDimRational;
  bool maximizing;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  basisStatusColsFirst;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  basisStatusRowsFirst;
  int numFailedRefinements;
  Rational errorCorrection;
  Rational errorCorrectionFactor;
  Rational violationImprovementFactor;
  Rational bestViolation;
  Rational maxViolation;
  int dualSize;
  int r;
  Verbosity old_verbosity;
  Rational maxScale;
  Rational dualScale;
  Rational primalScale;
  Rational dualViolation;
  Rational redCostViolation;
  Rational sideViolation;
  Rational boundsViolation;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  dualReal;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primalReal;
  Status result;
  undefined4 in_stack_fffffffffffff718;
  undefined4 in_stack_fffffffffffff71c;
  undefined4 uVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  undefined2 in_stack_fffffffffffff720;
  undefined2 uVar17;
  undefined2 in_stack_fffffffffffff722;
  undefined2 uVar18;
  undefined2 uVar19;
  undefined4 in_stack_fffffffffffff724;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined8 in_stack_fffffffffffff728;
  SolRational *sol_00;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff730;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar22;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar23;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *sol_01;
  Statistics *pSVar24;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff740;
  SolRational *in_stack_fffffffffffff748;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff750;
  undefined8 in_stack_fffffffffffff758;
  undefined8 in_stack_fffffffffffff760;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff768;
  bool *in_stack_fffffffffffff770;
  undefined8 in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff780;
  undefined4 in_stack_fffffffffffff784;
  uint in_stack_fffffffffffff788;
  undefined4 in_stack_fffffffffffff78c;
  undefined4 in_stack_fffffffffffff790;
  undefined4 in_stack_fffffffffffff794;
  undefined4 in_stack_fffffffffffff798;
  undefined1 in_stack_fffffffffffff79c;
  undefined1 in_stack_fffffffffffff79d;
  undefined1 in_stack_fffffffffffff79e;
  undefined1 in_stack_fffffffffffff79f;
  undefined8 in_stack_fffffffffffff7a0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff7a8;
  undefined4 in_stack_fffffffffffff7b0;
  int in_stack_fffffffffffff7b4;
  undefined4 in_stack_fffffffffffff7b8;
  undefined1 in_stack_fffffffffffff7bc;
  undefined1 in_stack_fffffffffffff7bd;
  undefined1 in_stack_fffffffffffff7be;
  undefined1 in_stack_fffffffffffff7bf;
  undefined8 in_stack_fffffffffffff7c0;
  Rational *in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7d0;
  VarStatus in_stack_fffffffffffff7d4;
  undefined2 in_stack_fffffffffffff7d8;
  undefined5 in_stack_fffffffffffff7da;
  undefined1 in_stack_fffffffffffff7df;
  undefined8 in_stack_fffffffffffff7e0;
  uint in_stack_fffffffffffff7e8;
  uint in_stack_fffffffffffff7ec;
  int in_stack_fffffffffffff7f0;
  int in_stack_fffffffffffff7f4;
  undefined4 in_stack_fffffffffffff7f8;
  undefined4 in_stack_fffffffffffff7fc;
  undefined8 in_stack_fffffffffffff800;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff808;
  undefined7 in_stack_fffffffffffff810;
  undefined8 local_7e8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_7d0;
  undefined8 in_stack_fffffffffffff858;
  SPxOut *in_stack_fffffffffffff870;
  undefined8 in_stack_fffffffffffff878;
  undefined8 in_stack_fffffffffffff880;
  SPxOut *in_stack_fffffffffffff888;
  SolRational *in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff898;
  int in_stack_fffffffffffff89c;
  SPxOut *in_stack_fffffffffffff918;
  undefined4 in_stack_fffffffffffff920;
  int in_stack_fffffffffffff924;
  int in_stack_fffffffffffff92c;
  undefined1 local_648 [40];
  SolRational *in_stack_fffffffffffff9e0;
  Rational *in_stack_fffffffffffff9e8;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff9f0;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff9f8;
  int local_5fc;
  char *local_5c8;
  SPxStatus local_5c0;
  SPxStatus local_5bc;
  uint local_5b8;
  uint local_5b4;
  uint local_5b0;
  int local_5ac;
  Verbosity local_5a8;
  fpclass_type local_5a4;
  double local_5a0;
  double local_598;
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [32];
  Verbosity local_510;
  Verbosity local_50c;
  undefined1 local_506;
  bool local_505 [5];
  uint local_500;
  undefined1 local_4f9;
  int local_4f8;
  byte local_4f1;
  undefined4 local_4c0;
  undefined4 local_4bc;
  VarStatus local_4b8 [18];
  double local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468 [2];
  undefined4 local_41c;
  undefined1 local_418 [55];
  undefined1 in_stack_fffffffffffffc1f;
  undefined8 in_stack_fffffffffffffc20;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc28;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc30;
  undefined6 in_stack_fffffffffffffc38;
  undefined1 in_stack_fffffffffffffc3e;
  undefined1 in_stack_fffffffffffffc3f;
  undefined8 in_stack_fffffffffffffc40;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc48;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffffc50;
  undefined1 in_stack_fffffffffffffc5f;
  undefined8 in_stack_fffffffffffffc60;
  undefined1 local_398 [80];
  int local_348;
  int local_344;
  Verbosity local_340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_33c [4];
  undefined1 local_2f8 [64];
  undefined1 local_2b8 [64];
  undefined1 local_278 [24];
  undefined8 in_stack_fffffffffffffda0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  local_238;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  local_1f8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  local_1b8 [2];
  Status local_12c;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_128;
  int local_120;
  byte local_11a;
  byte local_119;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_118;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_108;
  undefined1 *local_100;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_f8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_f0;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  shared_ptr<soplex::Tolerances> *local_b0;
  Rational *local_a8;
  undefined1 *local_a0;
  Rational *local_98;
  undefined1 *local_90;
  uint local_78 [2];
  double *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  uint local_60 [2];
  uint local_58 [2];
  undefined4 *local_50;
  undefined1 *local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined4 *local_30;
  VarStatus *local_28;
  undefined4 *local_20;
  undefined4 *local_18;
  double *local_10;
  
  iVar7 = SUB84(in_stack_fffffffffffff728,4);
  local_119 = in_DL & 1;
  local_11a = in_CL & 1;
  pTVar1 = in_RDI->_statistics->rationalTime;
  local_128 = in_R9;
  local_120 = in_R8D;
  local_118 = in_RSI;
  (*pTVar1->_vptr_Timer[3])(pTVar1,in_RSI,in_stack_00000008);
  *(undefined1 *)
   &(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
       *)&local_128->_vptr_SoPlexBase)->m_value).num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data = 0;
  *(undefined1 *)
   &(((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
       *)&in_stack_00000008->_vptr_SoPlexBase)->val).
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  *in_stack_00000010 = 0;
  *in_stack_00000018 = 0;
  *(undefined1 *)
   &(((rational_type *)&in_stack_00000020->_primal)->num).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data = 0;
  *(undefined1 *)
   &(((rational_type *)&in_stack_00000028->_vptr_SoPlexBase)->num).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data = 0;
  *(undefined1 *)
   &(((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
       *)&in_stack_00000030->_vptr_SoPlexBase)->m_value).num.m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data = 0;
  local_12c = 0;
  numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x4800d6);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT17(in_stack_fffffffffffff7bf,
                      CONCAT16(in_stack_fffffffffffff7be,
                               CONCAT15(in_stack_fffffffffffff7bd,
                                        CONCAT14(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8
                                                )))),in_stack_fffffffffffff7b4,
          SUB41(in_stack_fffffffffffff7b0,3));
  numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x48010c);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT17(in_stack_fffffffffffff7bf,
                      CONCAT16(in_stack_fffffffffffff7be,
                               CONCAT15(in_stack_fffffffffffff7bd,
                                        CONCAT14(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8
                                                )))),in_stack_fffffffffffff7b4,
          SUB41(in_stack_fffffffffffff7b0,3));
  numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x480140);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT17(in_stack_fffffffffffff7bf,
                      CONCAT16(in_stack_fffffffffffff7be,
                               CONCAT15(in_stack_fffffffffffff7bd,
                                        CONCAT14(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8
                                                )))),in_stack_fffffffffffff7b4,
          SUB41(in_stack_fffffffffffff7b0,3));
  numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x480174);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT17(in_stack_fffffffffffff7bf,
                      CONCAT16(in_stack_fffffffffffff7be,
                               CONCAT15(in_stack_fffffffffffff7bd,
                                        CONCAT14(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8
                                                )))),in_stack_fffffffffffff7b4,
          SUB41(in_stack_fffffffffffff7b0,3));
  numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x4801a8);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::reDim((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
           *)CONCAT17(in_stack_fffffffffffff7bf,
                      CONCAT16(in_stack_fffffffffffff7be,
                               CONCAT15(in_stack_fffffffffffff7bd,
                                        CONCAT14(in_stack_fffffffffffff7bc,in_stack_fffffffffffff7b8
                                                )))),in_stack_fffffffffffff7b4,
          SUB41(in_stack_fffffffffffff7b0,3));
  numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x4801cb);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(in_stack_fffffffffffff730,iVar7);
  numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x4801e7);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::VectorBase(in_stack_fffffffffffff730,iVar7);
  local_f8 = local_1b8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x480223);
  local_f0 = &local_1f8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x480244);
  local_e8 = &local_238;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x480265);
  local_e0 = local_278;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x480286);
  local_d8 = local_2b8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x4802a7);
  local_d0 = local_2f8;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x4802c8);
  local_c8 = local_33c[0]._M_local_buf + 4;
  boost::multiprecision::backends::
  rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
  ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                      *)0x4802e9);
  if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0xfffffffffffffff8) &&
     (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
    local_33c[0]._0_4_ = SPxOut::getVerbosity(&in_RDI->spxout);
    local_340 = INFO1;
    SPxOut::setVerbosity(&in_RDI->spxout,&local_340);
    soplex::operator<<((SPxOut *)
                       CONCAT44(in_stack_fffffffffffff724,
                                CONCAT22(in_stack_fffffffffffff722,in_stack_fffffffffffff720)),
                       (char *)CONCAT44(in_stack_fffffffffffff71c,in_stack_fffffffffffff718));
    SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&local_33c[0]._M_allocated_capacity);
  }
  if ((in_RDI->_hasBasis & 1U) != 0) {
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::get_const_ptr(&in_RDI->_basisStatusRows);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::get_const_ptr(&in_RDI->_basisStatusCols);
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::setBasis((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)in_stack_fffffffffffff7a0,
               (VarStatus *)
               CONCAT17(in_stack_fffffffffffff79f,
                        CONCAT16(in_stack_fffffffffffff79e,
                                 CONCAT15(in_stack_fffffffffffff79d,
                                          CONCAT14(in_stack_fffffffffffff79c,
                                                   in_stack_fffffffffffff798)))),
               (VarStatus *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
    pSVar11 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::basis(&in_RDI->_solver);
    SVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::status(pSVar11);
    in_RDI->_hasBasis = NO_PROBLEM < SVar6;
  }
  local_344 = numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x48052c);
  do {
    local_344 = local_344 + -1;
  } while (-1 < local_344);
  (*in_RDI->_statistics->rationalTime->_vptr_Timer[4])();
  bVar2 = boolParam(in_RDI,RECOVERY_MECHANISM);
  if (bVar2) {
    local_12c = _solveRealStable((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  *)in_stack_fffffffffffffc40,(bool)in_stack_fffffffffffffc3f,
                                 (bool)in_stack_fffffffffffffc3e,in_stack_fffffffffffffc30,
                                 in_stack_fffffffffffffc28,
                                 (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                  *)in_stack_fffffffffffffc20,
                                 (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                  *)in_stack_fffffffffffffda0,(bool)in_stack_fffffffffffffc1f);
  }
  else {
    local_12c = _solveRealForRational
                          ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffffc60,(bool)in_stack_fffffffffffffc5f,
                           in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                           (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                            *)in_stack_fffffffffffffc40,
                           (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                            *)CONCAT17(in_stack_fffffffffffffc3f,
                                       CONCAT16(in_stack_fffffffffffffc3e,in_stack_fffffffffffffc38)
                                      ));
  }
  uVar18 = (undefined2)((ulong)in_stack_00000018 >> 0x10);
  uVar20 = (undefined4)((ulong)in_stack_00000018 >> 0x20);
  uVar10 = SUB84(in_stack_00000010,0);
  uVar16 = (undefined4)((ulong)in_stack_00000010 >> 0x20);
  uVar17 = (short)in_stack_00000018;
  uVar19 = uVar18;
  uVar21 = uVar20;
  sol_00 = in_stack_00000020;
  pSVar22 = in_stack_00000028;
  sol_01 = in_stack_00000030;
  bVar2 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          ::
          _evaluateResult<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffff758,
                     (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffff750._M_pi,
                     (Status)((ulong)in_stack_fffffffffffff748 >> 0x20),
                     SUB81((ulong)in_stack_fffffffffffff748 >> 0x18,0),
                     (SolRational *)in_stack_fffffffffffff740,
                     (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_00000030,in_stack_fffffffffffff770,
                     (bool *)in_stack_fffffffffffff778,
                     (bool *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                     (bool *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                     (bool *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
  if (bVar2) {
    local_348 = 1;
  }
  else {
    (*in_RDI->_statistics->rationalTime->_vptr_Timer[3])();
    local_398._76_4_ = 0;
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::
    _storeRealSolutionAsRational<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (in_stack_fffffffffffff7a8,(SolRational *)in_stack_fffffffffffff7a0,
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT17(in_stack_fffffffffffff79f,
                           CONCAT16(in_stack_fffffffffffff79e,
                                    CONCAT15(in_stack_fffffffffffff79d,
                                             CONCAT14(in_stack_fffffffffffff79c,
                                                      in_stack_fffffffffffff798)))),
               (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
               (int *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788));
    local_98 = &in_RDI->_rationalPosone;
    local_90 = local_2b8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(uVar16,uVar10));
    local_a8 = &in_RDI->_rationalPosone;
    local_a0 = local_2f8;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(uVar16,uVar10));
    local_c0 = local_398;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x4807d1);
    local_108 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)&in_RDI->_rationalPosInfty;
    local_100 = &stack0xfffffffffffffc28;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)pSVar22,
                       (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)sol_00);
    local_41c = 0x10;
    local_48 = local_418;
    local_50 = &local_41c;
    local_58[0] = 0;
    local_58[1] = 0;
    local_60[0] = 0x10;
    local_60[1] = 0;
    local_18 = local_50;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>
              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                *)in_stack_fffffffffffff778,(longlong *)in_stack_fffffffffffff770,
               in_stack_fffffffffffff768);
    local_470 = 1.1;
    local_68 = local_468;
    local_70 = &local_470;
    local_78 = (uint  [2])0x0;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                        *)0x4808dc);
    local_10 = local_70;
    lVar15 = (longdouble)*local_70;
    uVar10 = SUB104(lVar15,0);
    uVar16 = (undefined4)((unkuint10)lVar15 >> 0x20);
    uVar17 = (undefined2)((unkuint10)lVar15 >> 0x40);
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
    ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                 *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                (longdouble)
                CONCAT28(in_stack_fffffffffffff7d8,
                         CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0)));
    local_4bc = 2;
    local_28 = local_4b8;
    local_30 = &local_4bc;
    local_38 = 0;
    local_40._0_1_ = true;
    local_40._1_3_ = 0;
    local_40._4_4_ = cpp_dec_float_finite;
    local_20 = local_30;
    boost::multiprecision::backends::
    rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
    ::rational_adaptor<long_long>
              ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                *)in_stack_fffffffffffff778,(longlong *)in_stack_fffffffffffff770,
               in_stack_fffffffffffff768);
    local_4c0 = 0;
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 *)pSVar22,(int)((ulong)sol_00 >> 0x20),(Verbosity)sol_00,
                (Real)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 *)pSVar22,(int)((ulong)sol_00 >> 0x20),(Verbosity)sol_00,
                (Real)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
    iVar7 = intParam(in_RDI,OBJSENSE);
    local_4f1 = iVar7 == 1;
    iVar7 = numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x480a31);
    iVar8 = numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x480a47);
    if (iVar8 < iVar7) {
      in_stack_fffffffffffff92c =
           numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)0x480a6f);
      iVar7 = in_stack_fffffffffffff92c;
    }
    else {
      in_stack_fffffffffffff924 =
           numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)0x480a95);
      iVar7 = in_stack_fffffffffffff924;
    }
    t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)CONCAT44(uVar16,uVar10)
    ;
    local_4f9 = 1;
    local_500 = 0;
    local_505[1] = false;
    local_505[2] = false;
    local_505[3] = false;
    local_505[4] = false;
    local_4f8 = iVar7;
    while( true ) {
      uVar10 = (undefined4)((ulong)sol_01 >> 0x20);
      local_120 = local_120 + -1;
      SPxOut::
      debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[30],_0>
                (in_RDI,(char (*) [30])"Computing primal violations.\n");
      _computeBoundsViolation
                (in_stack_fffffffffffff7a8,(SolRational *)in_stack_fffffffffffff7a0,
                 (Rational *)
                 CONCAT17(in_stack_fffffffffffff79f,
                          CONCAT16(in_stack_fffffffffffff79e,
                                   CONCAT15(in_stack_fffffffffffff79d,
                                            CONCAT14(in_stack_fffffffffffff79c,
                                                     in_stack_fffffffffffff798)))));
      _computeSidesViolation
                ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)CONCAT17(in_stack_fffffffffffff7bf,
                             CONCAT16(in_stack_fffffffffffff7be,
                                      CONCAT15(in_stack_fffffffffffff7bd,
                                               CONCAT14(in_stack_fffffffffffff7bc,
                                                        in_stack_fffffffffffff7b8)))),
                 (SolRational *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                 (Rational *)in_stack_fffffffffffff7a8);
      SPxOut::
      debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[28],_0>
                (in_RDI,(char (*) [28])"Computing dual violations.\n");
      _computeReducedCostViolation
                (in_stack_fffffffffffff808,(SolRational *)in_stack_fffffffffffff800,
                 (Rational *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                 (bool *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      _computeDualViolation
                (in_stack_fffffffffffff808,(SolRational *)in_stack_fffffffffffff800,
                 (Rational *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                 (bool *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                  (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)t);
      if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)0xfffffffffffffff8) &&
         (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
        local_50c = SPxOut::getVerbosity(&in_RDI->spxout);
        local_510 = INFO1;
        SPxOut::setVerbosity(&in_RDI->spxout,&local_510);
        in_stack_fffffffffffff918 =
             soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)sol_00,CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                         (fmtflags)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),t);
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        orderOfMagnitude((Rational *)in_stack_fffffffffffff858);
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                           (int)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)sol_00,CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                         (fmtflags)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),t);
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        orderOfMagnitude((Rational *)in_stack_fffffffffffff858);
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                           (int)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)sol_00,CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                         (fmtflags)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),t);
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        in_stack_fffffffffffff89c = orderOfMagnitude((Rational *)in_stack_fffffffffffff858);
        in_stack_fffffffffffff890 =
             (SolRational *)
             soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                                (int)((ulong)t >> 0x20));
        in_stack_fffffffffffff888 =
             soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        in_stack_fffffffffffff880 =
             soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::str_abi_cxx11_((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)sol_00,CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                         (fmtflags)((ulong)t >> 0x20));
        in_stack_fffffffffffff878 =
             soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),t);
        in_stack_fffffffffffff870 =
             soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        orderOfMagnitude((Rational *)in_stack_fffffffffffff858);
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                           (int)((ulong)t >> 0x20));
        soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
        std::__cxx11::string::~string(local_590);
        std::__cxx11::string::~string(local_570);
        std::__cxx11::string::~string(local_550);
        std::__cxx11::string::~string(local_530);
        SPxOut::setVerbosity(&in_RDI->spxout,&local_50c);
      }
      pSVar24 = in_RDI->_statistics;
      (*pSVar24->solvingTime->_vptr_Timer[6])();
      in_stack_fffffffffffff858 = extraout_XMM0_Qa;
      (*in_RDI->_statistics->rationalTime->_vptr_Timer[6])();
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)t,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                               *)0x4811a9);
      if (tVar3) {
        local_7d0 = local_1b8;
      }
      else {
        local_7d0 = &local_1f8;
      }
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                          *)t,(number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                               *)0x481208);
      if (tVar3) {
        local_7e8 = &local_238;
      }
      else {
        local_7e8 = local_278;
      }
      uVar21 = (undefined4)((ulong)local_7e8 >> 0x20);
      SPxOut::
      debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[45],_int_&,_int_&,_double,_double,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_&,_boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_&,_0>
                (in_RDI,(char (*) [45])"Progress table: {} & {} & {} & {} & {} & {}\n",
                 &pSVar24->refinements,&pSVar24->iterations,&local_598,&local_5a0,local_7d0,
                 (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                  *)local_7e8);
      pSVar24 = (Statistics *)CONCAT44(uVar10,local_4c0);
      uVar17 = (undefined2)local_120;
      uVar19 = (undefined2)((uint)local_120 >> 0x10);
      t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
      sol_00 = in_stack_00000020;
      pSVar22 = in_stack_00000028;
      uVar4 = _isRefinementOver(in_stack_fffffffffffff768,(bool *)in_stack_fffffffffffff760,
                                (bool *)in_stack_fffffffffffff758,
                                (Rational *)in_stack_fffffffffffff750._M_pi,
                                (Rational *)in_stack_fffffffffffff748,
                                (Rational *)in_stack_fffffffffffff740,
                                (Rational *)
                                CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                                in_stack_fffffffffffff788,
                                (bool *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790
                                                ),
                                (bool *)CONCAT17(in_stack_fffffffffffff79f,
                                                 CONCAT16(in_stack_fffffffffffff79e,
                                                          CONCAT15(in_stack_fffffffffffff79d,
                                                                   CONCAT14(
                                                  in_stack_fffffffffffff79c,
                                                  in_stack_fffffffffffff798)))),
                                (int)in_stack_fffffffffffff7a0);
      if ((bool)uVar4) break;
      _checkRefinementProgress
                ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff758,(Rational *)in_stack_fffffffffffff750._M_pi,
                 (Rational *)in_stack_fffffffffffff748,(Rational *)in_stack_fffffffffffff740,
                 (Rational *)pSVar24,(Rational *)pSVar22,(Rational *)in_stack_fffffffffffff7e0,
                 (Rational *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                 (int *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0));
      in_stack_fffffffffffff768 =
           (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)&local_506;
      in_stack_fffffffffffff760 = local_505;
      sol_00 = (SolRational *)local_398;
      uVar17 = SUB82(local_4b8,0);
      uVar19 = (undefined2)((ulong)local_4b8 >> 0x10);
      uVar21 = (undefined4)((ulong)local_4b8 >> 0x20);
      t = local_468;
      pSVar23 = local_118;
      sol_01 = local_128;
      in_stack_fffffffffffff740 = in_stack_00000008;
      in_stack_fffffffffffff748 = in_stack_00000020;
      in_stack_fffffffffffff750._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_stack_00000028;
      in_stack_fffffffffffff758 = in_stack_00000030;
      in_stack_fffffffffffff808 =
           (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)&stack0xfffffffffffff718;
      _ratrecAndOrRatfac((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                         (int *)in_stack_fffffffffffff7a8,(int *)in_stack_fffffffffffff7a0,
                         (int *)CONCAT17(in_stack_fffffffffffff79f,
                                         CONCAT16(in_stack_fffffffffffff79e,
                                                  CONCAT15(in_stack_fffffffffffff79d,
                                                           CONCAT14(in_stack_fffffffffffff79c,
                                                                    in_stack_fffffffffffff798)))),
                         (bool *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790),
                         (int *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                         (Rational *)in_stack_fffffffffffff7c0,in_stack_fffffffffffff7c8,
                         (Rational *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                         (SolRational *)
                         CONCAT17(in_stack_fffffffffffff7df,
                                  CONCAT52(in_stack_fffffffffffff7da,in_stack_fffffffffffff7d8)),
                         (bool *)in_stack_fffffffffffff7e0,
                         (bool *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                         (bool *)CONCAT44(in_stack_fffffffffffff7f4,in_stack_fffffffffffff7f0),
                         (bool *)CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8),
                         (bool *)in_stack_fffffffffffff800,(bool *)&stack0xfffffffffffff718,
                         (bool *)CONCAT17(uVar4,in_stack_fffffffffffff810));
      if ((local_505[0] & 1U) != 0) break;
      if ((local_506 & 1) == 0) {
        _computePrimalScalingFactor
                  ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_fffffffffffff750._M_pi,(Rational *)in_stack_fffffffffffff748,
                   (Rational *)in_stack_fffffffffffff740,(Rational *)sol_01,(Rational *)pSVar23,
                   (Rational *)sol_00);
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        _applyScaledBounds<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_fffffffffffff92c,iVar7),
                   (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_fffffffffffff924,in_stack_fffffffffffff920),
                   (Rational *)in_stack_fffffffffffff918);
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        _applyScaledSides<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_fffffffffffff880,
                   (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_fffffffffffff878,(Rational *)in_stack_fffffffffffff870);
        _computeDualScalingFactor
                  ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT17(in_stack_fffffffffffff7bf,
                               CONCAT16(in_stack_fffffffffffff7be,
                                        CONCAT15(in_stack_fffffffffffff7bd,
                                                 CONCAT14(in_stack_fffffffffffff7bc,
                                                          in_stack_fffffffffffff7b8)))),
                   (Rational *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                   (Rational *)in_stack_fffffffffffff7a8,(Rational *)in_stack_fffffffffffff7a0,
                   (Rational *)
                   CONCAT17(in_stack_fffffffffffff79f,
                            CONCAT16(in_stack_fffffffffffff79e,
                                     CONCAT15(in_stack_fffffffffffff79d,
                                              CONCAT14(in_stack_fffffffffffff79c,
                                                       in_stack_fffffffffffff798)))),
                   (Rational *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        _applyScaledObj<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (in_stack_fffffffffffff9f8,in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                   in_stack_fffffffffffff9e0);
        if ((in_RDI != (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)0xfffffffffffffff8) &&
           (VVar5 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar5)) {
          in_stack_fffffffffffff800 = &in_RDI->spxout;
          local_5a4 = SPxOut::getVerbosity((SPxOut *)in_stack_fffffffffffff800);
          local_5a8 = INFO1;
          SPxOut::setVerbosity((SPxOut *)in_stack_fffffffffffff800,&local_5a8);
          soplex::operator<<((SPxOut *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(char *)t);
          SPxOut::setVerbosity(&in_RDI->spxout,&local_5a4);
        }
        in_stack_fffffffffffff7fc =
             LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
             ::num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                    *)0x4815f3);
        if ((0 < (int)in_stack_fffffffffffff7fc) && ((in_RDI->_hasBasis & 1U) != 0)) {
          in_stack_fffffffffffff7f8 =
               numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                *)0x48162e);
          in_stack_fffffffffffff7f4 =
               LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
               ::num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)0x48164b);
          local_5ac = in_stack_fffffffffffff7f8 - in_stack_fffffffffffff7f4;
          local_5b0 = 0;
          while( true ) {
            in_stack_fffffffffffff7ec = local_5b0;
            in_stack_fffffffffffff7f0 =
                 LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ::num((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)0x481698);
            if (in_stack_fffffffffffff7f0 <= (int)in_stack_fffffffffffff7ec) break;
            in_stack_fffffffffffff7e0 =
                 LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                 ::colVector((LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                              *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(int)((ulong)t >> 0x20));
            pcVar12 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      ::index((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                               *)in_stack_fffffffffffff7e0,(char *)0x0,__c);
            local_5b4 = (uint)pcVar12;
            local_5b8 = local_5ac + local_5b0;
            pVVar14 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                      ::operator[](&in_RDI->_basisStatusRows,local_5b4);
            if ((*pVVar14 == BASIC) &&
               (pVVar14 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                          ::operator[](&in_RDI->_basisStatusCols,local_5b8), *pVVar14 != BASIC)) {
              this_00 = &in_RDI->_basisStatusCols;
              in_stack_fffffffffffff7d8 = SUB82(this_00,0);
              in_stack_fffffffffffff7da = (undefined5)((ulong)this_00 >> 0x10);
              in_stack_fffffffffffff7df = (undefined1)((ulong)this_00 >> 0x38);
              pVVar14 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                        ::operator[](this_00,local_5b8);
              in_stack_fffffffffffff7d4 = *pVVar14;
              pVVar14 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                        ::operator[](&in_RDI->_basisStatusRows,local_5b4);
              *pVVar14 = in_stack_fffffffffffff7d4;
              pVVar14 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                        ::operator[]((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                      *)CONCAT17(in_stack_fffffffffffff7df,
                                                 CONCAT52(in_stack_fffffffffffff7da,
                                                          in_stack_fffffffffffff7d8)),local_5b8);
              *pVVar14 = BASIC;
              SLUFactorRational::clear
                        ((SLUFactorRational *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
            }
            local_5b0 = local_5b0 + 1;
          }
        }
        if ((in_RDI->_hasBasis & 1U) != 0) {
          pSVar11 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::basis(&in_RDI->_solver);
          SVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::status(pSVar11);
          if (SVar6 < REGULAR) {
            pSVar11 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::basis(&in_RDI->_solver);
            local_5bc = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::status(pSVar11);
            SPxOut::
            debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[38],_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxStatus,_0>
                      (in_RDI,(char (*) [38])"basis (status = {}) desc before set:\n",&local_5bc);
            in_stack_fffffffffffff7c0 = &in_RDI->_solver;
            in_stack_fffffffffffff7c8 =
                 (Rational *)
                 DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                 ::get_const_ptr(&in_RDI->_basisStatusRows);
            DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
            ::get_const_ptr(&in_RDI->_basisStatusCols);
            SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::setBasis((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffff7a0,
                       (VarStatus *)
                       CONCAT17(in_stack_fffffffffffff79f,
                                CONCAT16(in_stack_fffffffffffff79e,
                                         CONCAT15(in_stack_fffffffffffff79d,
                                                  CONCAT14(in_stack_fffffffffffff79c,
                                                           in_stack_fffffffffffff798)))),
                       (VarStatus *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
            pSVar11 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::basis(&in_RDI->_solver);
            local_5c0 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::status(pSVar11);
            SPxOut::
            debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[37],_soplex::SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::SPxStatus,_0>
                      (in_RDI,(char (*) [37])"basis (status = {}) desc after set:\n",&local_5c0);
            pSVar11 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      ::basis(&in_RDI->_solver);
            SVar6 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::status(pSVar11);
            in_RDI->_hasBasis = NO_PROBLEM < SVar6;
            local_5c8 = "failed";
            if ((in_RDI->_hasBasis & 1U) != 0) {
              local_5c8 = "successful";
            }
            SPxOut::
            debug<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>,_const_char_(&)[32],_const_char_*,_0>
                      (in_RDI,(char (*) [32])"setting basis in solver {} (3)\n",&local_5c8);
          }
        }
        iVar8 = in_RDI->_statistics->iterations;
        (*in_RDI->_statistics->rationalTime->_vptr_Timer[4])();
        bVar2 = boolParam(in_RDI,RECOVERY_MECHANISM);
        if (bVar2) {
          in_stack_fffffffffffff7a0 = &in_RDI->_basisStatusRows;
          in_stack_fffffffffffff7a8 =
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)&in_RDI->_basisStatusCols;
          in_stack_fffffffffffff79e = local_119;
          in_stack_fffffffffffff79f = local_11a;
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                              *)sol_00,(double *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
          in_stack_fffffffffffff7b4 = CONCAT13(tVar3,(int3)in_stack_fffffffffffff7b4);
          in_stack_fffffffffffff79d = true;
          if (!tVar3) {
            in_stack_fffffffffffff79c =
                 boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)sol_00,(double *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
            in_stack_fffffffffffff79d = in_stack_fffffffffffff79c;
          }
          in_stack_fffffffffffff798 =
               _solveRealStable((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffffc40,(bool)in_stack_fffffffffffffc3f,
                                (bool)in_stack_fffffffffffffc3e,in_stack_fffffffffffffc30,
                                in_stack_fffffffffffffc28,
                                (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                 *)in_stack_fffffffffffffc20,
                                (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                                 *)in_stack_fffffffffffffda0,(bool)in_stack_fffffffffffffc1f);
          local_12c = in_stack_fffffffffffff798;
        }
        else {
          intParam(in_RDI,SIMPLIFIER);
          in_stack_fffffffffffff7bf =
               boost::multiprecision::operator>
                         ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)sol_00,(double *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
          in_stack_fffffffffffff7be = true;
          if (!(bool)in_stack_fffffffffffff7bf) {
            in_stack_fffffffffffff7bd =
                 boost::multiprecision::operator>
                           ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)sol_00,(double *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
            in_stack_fffffffffffff7be = in_stack_fffffffffffff7bd;
          }
          if ((type_conflict5)in_stack_fffffffffffff7be != false) {
            setIntParam((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                        (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),
                        (int)in_stack_fffffffffffff7e0,(bool)in_stack_fffffffffffff7df);
          }
          in_stack_fffffffffffff7b8 =
               _solveRealForRational
                         ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           *)in_stack_fffffffffffffc60,(bool)in_stack_fffffffffffffc5f,
                          in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
                          (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                           *)in_stack_fffffffffffffc40,
                          (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                           *)CONCAT17(in_stack_fffffffffffffc3f,
                                      CONCAT16(in_stack_fffffffffffffc3e,in_stack_fffffffffffffc38))
                         );
          local_12c = in_stack_fffffffffffff7b8;
          setIntParam((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)CONCAT44(in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e8),
                      (int)((ulong)in_stack_fffffffffffff7e0 >> 0x20),(int)in_stack_fffffffffffff7e0
                      ,(bool)in_stack_fffffffffffff7df);
        }
        in_RDI->_statistics->refinements = in_RDI->_statistics->refinements + 1;
        if (iVar8 < in_RDI->_statistics->iterations) {
          local_4f9 = 1;
          local_500 = 0;
          in_RDI->_statistics->pivotRefinements = in_RDI->_statistics->refinements;
        }
        else {
          local_500 = local_500 + 1;
          in_RDI->_statistics->stallRefinements = in_RDI->_statistics->stallRefinements + 1;
        }
        uVar17 = (short)in_stack_00000018;
        uVar19 = uVar18;
        uVar21 = uVar20;
        sol_00 = in_stack_00000020;
        pSVar22 = in_stack_00000028;
        sol_01 = in_stack_00000030;
        bVar2 = SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ::
                _evaluateResult<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff758,
                           (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff750._M_pi,
                           (Status)((ulong)in_stack_fffffffffffff748 >> 0x20),
                           SUB81((ulong)in_stack_fffffffffffff748 >> 0x18,0),
                           (SolRational *)in_stack_fffffffffffff740,
                           (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_00000030,in_stack_fffffffffffff770,
                           (bool *)in_stack_fffffffffffff778,
                           (bool *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780),
                           (bool *)CONCAT44(in_stack_fffffffffffff78c,in_stack_fffffffffffff788),
                           (bool *)CONCAT44(in_stack_fffffffffffff794,in_stack_fffffffffffff790));
        in_stack_fffffffffffff794._3_1_ = bVar2;
        if (bVar2) {
          local_348 = 1;
          goto LAB_004820aa;
        }
        (*in_RDI->_statistics->rationalTime->_vptr_Timer[3])();
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        _correctPrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(in_stack_fffffffffffff89c,in_stack_fffffffffffff898),
                   in_stack_fffffffffffff890,(Rational *)in_stack_fffffffffffff888,
                   (int *)in_stack_fffffffffffff880,(int *)in_stack_fffffffffffff878,
                   (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_fffffffffffff870);
        _updateSlacks(pSVar22,sol_00,(int *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::size(&(in_RDI->_primalDualDiff).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              );
        uVar17 = SUB82(&local_4f8,0);
        uVar19 = (undefined2)((ulong)&local_4f8 >> 0x10);
        uVar21 = (undefined4)((ulong)&local_4f8 >> 0x20);
        t = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_398 + 0x4c);
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
        ::
        _correctDualSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  ((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_fffffffffffff7e0,
                   (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT17(in_stack_fffffffffffff7df,
                               CONCAT52(in_stack_fffffffffffff7da,in_stack_fffffffffffff7d8)),
                   (SolRational *)CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0),
                   (bool *)in_stack_fffffffffffff7c8,
                   (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)in_stack_fffffffffffff7c0,
                   (Rational *)
                   CONCAT17(in_stack_fffffffffffff7bf,
                            CONCAT16(in_stack_fffffffffffff7be,
                                     CONCAT15(in_stack_fffffffffffff7bd,
                                              CONCAT14(in_stack_fffffffffffff7bc,
                                                       in_stack_fffffffffffff7b8)))),
                   (int *)in_stack_fffffffffffff800,(int *)in_stack_fffffffffffff808);
        _updateReducedCosts(in_stack_fffffffffffff740,(SolRational *)sol_01,(int *)pSVar22,
                            (int *)sol_00);
      }
    }
    if ((in_RDI->_hasBasis & 1U) != 0) {
      local_5fc = numRowsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)0x481e7e);
      while (local_5fc = local_5fc + -1, -1 < local_5fc) {
        pRVar13 = DataArray<soplex::SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::RangeType>
                  ::operator[](&in_RDI->_rowTypes,local_5fc);
        if (*pRVar13 != RANGETYPE_FIXED) {
          pVVar14 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                    ::operator[](&in_RDI->_basisStatusRows,local_5fc);
          if (*pVVar14 == FIXED) {
            uVar9 = local_4f1 & 1;
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
            ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                          *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),(int)((ulong)t >> 0x20));
            tVar3 = boost::multiprecision::operator<
                              ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                                *)sol_00,(int *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
            uVar10 = ZEXT14(uVar9 == tVar3);
            pVVar14 = DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                      ::operator[](&in_RDI->_basisStatusRows,local_5fc);
            *pVVar14 = uVar10;
          }
        }
      }
    }
    if (((ulong)local_118[2].
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage & 1) != 0) {
      pSVar23 = local_118;
      SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::maxObj((SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                *)0x481fc5);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::operator*((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)pSVar23,
                  (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)in_stack_fffffffffffff768);
      local_b0 = &local_118[1]._tolerances;
      local_b8 = local_648;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)),
                  (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                   *)t);
      boost::multiprecision::
      number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
      ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                 *)0x48202d);
      iVar7 = intParam(in_RDI,OBJSENSE);
      if (iVar7 == -1) {
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>,(boost::multiprecision::expression_template_option)1>
        ::operator*=((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)sol_00,(int *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
      }
    }
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::clearRowObjs((SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
    (*in_RDI->_statistics->rationalTime->_vptr_Timer[4])();
    local_348 = 0;
LAB_004820aa:
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::~DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                  *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::~DataArray((DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
                  *)CONCAT44(uVar21,CONCAT22(uVar19,uVar17)));
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x4820d1);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x4820de);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x4820eb);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x4820f8);
    boost::multiprecision::
    number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
    ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
               *)0x482105);
  }
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x482112);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x48211f);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x48212c);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x482139);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x482146);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x482153);
  boost::multiprecision::
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
             *)0x482160);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x48216d);
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)0x48217a);
  return;
}

Assistant:

void SoPlexBase<R>::_performOptIRStable(
   SolRational& sol,
   bool acceptUnbounded,
   bool acceptInfeasible,
   int minIRRoundsRemaining,
   bool& primalFeasible,
   bool& dualFeasible,
   bool& infeasible,
   bool& unbounded,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error)
{
   assert(boolParam(SoPlexBase<R>::ITERATIVE_REFINEMENT));

   // start rational solving timing
   _statistics->rationalTime->start();

   primalFeasible = false;
   dualFeasible = false;
   infeasible = false;
   unbounded = false;
   stoppedTime = false;
   stoppedIter = false;
   error = false;

   // declare vectors and variables
   typename SPxSolverBase<R>::Status result = SPxSolverBase<R>::UNKNOWN;

   _modLower.reDim(numColsRational(), false);
   _modUpper.reDim(numColsRational(), false);
   _modLhs.reDim(numRowsRational(), false);
   _modRhs.reDim(numRowsRational(), false);
   _modObj.reDim(numColsRational(), false);

   VectorBase<R> primalReal(numColsRational());
   VectorBase<R> dualReal(numRowsRational());

   Rational boundsViolation;
   Rational sideViolation;
   Rational redCostViolation;
   Rational dualViolation;
   Rational primalScale;
   Rational dualScale;
   Rational maxScale;

   // solve original LP
   SPX_MSG_INFO1(spxout, spxout << "Initial floating-point solve . . .\n");

   if(_hasBasis)
   {
      assert(_basisStatusRows.size() == numRowsRational());
      assert(_basisStatusCols.size() == numColsRational());
      _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);
   }

   for(int r = numRowsRational() - 1; r >= 0; r--)
   {
      assert(_solver.maxRowObj(r) == 0.0);
   }

   _statistics->rationalTime->stop();

   // determine if we should use the recovery mechanism pipeline in case of fails
   if(!boolParam(SoPlexBase<R>::RECOVERY_MECHANISM))
      result = _solveRealForRational(false, primalReal, dualReal, _basisStatusRows, _basisStatusCols);
   else
      result = _solveRealStable(acceptUnbounded, acceptInfeasible, primalReal, dualReal, _basisStatusRows,
                                _basisStatusCols);

   // evalute result
   if(_evaluateResult<R>(_solver, result, false, sol, dualReal, infeasible, unbounded, stoppedTime,
                         stoppedIter,
                         error))
      return;

   _statistics->rationalTime->start();

   int dualSize = 0;

   // stores floating-point solution of original LP as current rational solution
   // ensure that solution vectors have right dimension; ensure that solution is aligned with basis
   _storeRealSolutionAsRational<R>(sol, primalReal, dualReal, dualSize);

   // initial scaling factors are one
   primalScale = _rationalPosone;
   dualScale = _rationalPosone;

   // control progress
   Rational maxViolation;
   Rational bestViolation = _rationalPosInfty;
   const Rational violationImprovementFactor = 16;
   const Rational errorCorrectionFactor = 1.1;
   Rational errorCorrection = 2;
   int numFailedRefinements = 0;

   // store basis status in case solving modified problem failed
   DataArray< typename SPxSolverBase<R>::VarStatus > basisStatusRowsFirst;
   DataArray< typename SPxSolverBase<R>::VarStatus > basisStatusColsFirst;

   // refinement loop
   const bool maximizing = (intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MAXIMIZE);
   const int maxDimRational = numColsRational() > numRowsRational() ? numColsRational() :
                              numRowsRational();
   bool factorSolNewBasis = true;
   int lastStallRefinements = 0;
   int nextRatrecRefinement = 0;

   // used in _ratrecAndOrRatfac to order a break or a continue outside of the function.
   bool breakAfter;
   bool continueAfter;

   do
   {
      // decrement minIRRoundsRemaining counter
      minIRRoundsRemaining--;

      SPxOut::debug(this, "Computing primal violations.\n");

      // computes violation of bounds
      _computeBoundsViolation(sol, boundsViolation);

      // computes violation of sides
      _computeSidesViolation(sol, sideViolation);

      SPxOut::debug(this, "Computing dual violations.\n");

      // compute reduced cost violation
      _computeReducedCostViolation(sol, redCostViolation, maximizing);

      // compute dual violation
      _computeDualViolation(sol, dualViolation, maximizing);

      _modObj = sol._redCost;

      // output violations; the reduced cost violations for artificially introduced slack columns are actually violations of the dual multipliers
      SPX_MSG_INFO1(spxout, spxout
                    << "Max. bound violation = " << boundsViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       boundsViolation) << "\n"
                    << "Max. row violation = " << sideViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       sideViolation) << "\n"
                    << "Max. reduced cost violation = " << redCostViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       redCostViolation) << "\n"
                    << "Max. dual violation = " << dualViolation.str() << ", ofm = 1e" << orderOfMagnitude(
                       dualViolation) << "\n");


      SPxOut::debug(this, "Progress table: {} & {} & {} & {} & {} & {}\n", _statistics->refinements,
                    _statistics->iterations, _statistics->solvingTime->time(), _statistics->rationalTime->time(),
                    boundsViolation > sideViolation ? boundsViolation : sideViolation,
                    redCostViolation > dualViolation ? redCostViolation : dualViolation);

      // check termination criteria for refinement loop
      if(_isRefinementOver(primalFeasible, dualFeasible, boundsViolation, sideViolation, redCostViolation,
                           dualViolation,
                           minIRRoundsRemaining, stoppedTime, stoppedIter, numFailedRefinements))
         break;

      // check refinement progress
      _checkRefinementProgress(boundsViolation, sideViolation, redCostViolation, dualViolation,
                               maxViolation, bestViolation, violationImprovementFactor, numFailedRefinements);

      // perform rational reconstruction and/or factorization
      _ratrecAndOrRatfac(minIRRoundsRemaining, lastStallRefinements, _statistics->refinements,
                         factorSolNewBasis,
                         nextRatrecRefinement,
                         errorCorrectionFactor, errorCorrection, maxViolation,
                         sol, primalFeasible, dualFeasible,
                         stoppedTime, stoppedIter, error, breakAfter, continueAfter);

      if(breakAfter)
         break;
      else if(continueAfter)
         continue;

      // start refinement

      // compute primal scaling factor; limit increase in scaling by tolerance used in floating point solve
      _computePrimalScalingFactor(maxScale, primalScale, boundsViolation, sideViolation,
                                  redCostViolation);

      // apply scaled bounds and scaled sides
      _applyScaledBounds<R>(_solver, primalScale);
      _applyScaledSides<R>(_solver, primalScale);

      // compute dual scaling factor; limit increase in scaling by tolerance used in floating point solve
      _computeDualScalingFactor(maxScale, primalScale, dualScale, redCostViolation, dualViolation);

      // apply scaled objective function
      _applyScaledObj<R>(_solver, dualScale, sol);

      SPX_MSG_INFO1(spxout, spxout << "Refined floating-point solve . . .\n");

      // ensure that artificial slack columns are basic and inequality constraints are nonbasic; otherwise we may end
      // up with dual violation on inequality constraints after removing the slack columns; do not change this in the
      // floating-point solver, though, because the solver may require its original basis to detect optimality
      if(_slackCols.num() > 0 && _hasBasis)
      {
         int numOrigCols = numColsRational() - _slackCols.num();
         assert(_slackCols.num() <= 0 || boolParam(SoPlexBase<R>::EQTRANS));

         for(int i = 0; i < _slackCols.num(); i++)
         {
            int row = _slackCols.colVector(i).index(0);
            int col = numOrigCols + i;

            assert(row >= 0);
            assert(row < numRowsRational());

            if(_basisStatusRows[row] == SPxSolverBase<R>::BASIC
                  && _basisStatusCols[col] != SPxSolverBase<R>::BASIC)
            {
               _basisStatusRows[row] = _basisStatusCols[col];
               _basisStatusCols[col] = SPxSolverBase<R>::BASIC;
               _rationalLUSolver.clear();
            }
         }
      }

      // load basis
      if(_hasBasis && _solver.basis().status() < SPxBasisBase<R>::REGULAR)
      {
         SPxOut::debug(this, "basis (status = {}) desc before set:\n", _solver.basis().status());
#ifdef SOPLEX_DEBUG
         _solver.basis().desc().dump();
#endif
         _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
         SPxOut::debug(this, "basis (status = {}) desc after set:\n", _solver.basis().status());
#ifdef SOPLEX_DEBUG
         _solver.basis().desc().dump();
#endif
         _hasBasis = _solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM;
         SPxOut::debug(this, "setting basis in solver {} (3)\n", (_hasBasis ? "successful" : "failed"));
      }

      // solve modified problem
      int prevIterations = _statistics->iterations;
      _statistics->rationalTime->stop();

      // determine if recovery pipeline should be used
      if(!boolParam(SoPlexBase<R>::RECOVERY_MECHANISM))
      {
         // turn off simplifier if scaling factors are too high
         int simplifier = intParam(SoPlexBase<R>::SIMPLIFIER);

         if(primalScale > 1e20 || dualScale > 1e20)
            setIntParam(SoPlexBase<R>::SIMPLIFIER, SoPlexBase<R>::SIMPLIFIER_OFF);

         result = _solveRealForRational(false, primalReal, dualReal, _basisStatusRows, _basisStatusCols);
         // reset simplifier param to previous value
         setIntParam(SoPlexBase<R>::SIMPLIFIER, simplifier);
      }
      else
         result = _solveRealStable(acceptUnbounded, acceptInfeasible, primalReal, dualReal, _basisStatusRows,
                                   _basisStatusCols, primalScale > 1e20 || dualScale > 1e20);

      // count refinements and remember whether we moved to a new basis
      _statistics->refinements++;

      if(_statistics->iterations <= prevIterations)
      {
         lastStallRefinements++;
         _statistics->stallRefinements++;
      }
      else
      {
         factorSolNewBasis = true;
         lastStallRefinements = 0;
         _statistics->pivotRefinements = _statistics->refinements;
      }

      // evaluate result; if modified problem was not solved to optimality, stop refinement;
      if(_evaluateResult<R>(_solver, result, true, sol, dualReal, infeasible, unbounded, stoppedTime,
                            stoppedIter,
                            error))
         return;

      _statistics->rationalTime->start();

      int primalSize;

      // correct primal solution and align with basis
      _correctPrimalSolution<R>(sol, primalScale, primalSize, maxDimRational, primalReal);

      // update or recompute slacks depending on which looks faster
      _updateSlacks(sol, primalSize);

      const int numCorrectedPrimals = _primalDualDiff.size();

      // correct dual solution and align with basis
      _correctDualSolution<R>(_solver, sol, maximizing, dualReal, dualScale, dualSize, maxDimRational);

      // update or recompute reduced cost values depending on which looks faster
      // adding one to the length of the dual vector accounts for the objective function vector
      _updateReducedCosts(sol, dualSize, numCorrectedPrimals);
   }
   while(true);

   // correct basis status for restricted inequalities
   if(_hasBasis)
   {
      for(int r = numRowsRational() - 1; r >= 0; r--)
      {
         assert((lhsRational(r) == rhsRational(r)) == (_rowTypes[r] == RANGETYPE_FIXED));

         if(_rowTypes[r] != RANGETYPE_FIXED && _basisStatusRows[r] == SPxSolverBase<R>::FIXED)
            _basisStatusRows[r] = (maximizing == (sol._dual[r] < 0))
                                  ? SPxSolverBase<R>::ON_LOWER
                                  : SPxSolverBase<R>::ON_UPPER;
      }
   }

   // compute objective function values
   assert(sol._isPrimalFeasible == sol._isDualFeasible);

   if(sol._isPrimalFeasible)
   {
      sol._objVal = sol._primal * _rationalLP->maxObj();

      if(intParam(SoPlexBase<R>::OBJSENSE) == SoPlexBase<R>::OBJSENSE_MINIMIZE)
         sol._objVal *= -1;
   }

   // set objective coefficients for all rows to zero
   _solver.clearRowObjs();

   // stop rational solving time
   _statistics->rationalTime->stop();
}